

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O0

FT_Error cff_parser_init(CFF_Parser parser,FT_UInt code,void *object,FT_Library library,
                        FT_UInt stackSize,FT_UShort num_designs,FT_UShort num_axes)

{
  FT_Byte **ppFVar1;
  int local_3c;
  FT_Memory pFStack_38;
  FT_Error error;
  FT_Memory memory;
  FT_UShort num_designs_local;
  FT_Library pFStack_28;
  FT_UInt stackSize_local;
  FT_Library library_local;
  void *object_local;
  CFF_Parser pCStack_10;
  FT_UInt code_local;
  CFF_Parser parser_local;
  
  pFStack_38 = library->memory;
  memory._2_2_ = num_designs;
  memory._4_4_ = stackSize;
  pFStack_28 = library;
  library_local = (FT_Library)object;
  object_local._4_4_ = code;
  pCStack_10 = parser;
  memset(parser,0,0x48);
  pCStack_10->object_code = object_local._4_4_;
  pCStack_10->object = library_local;
  pCStack_10->library = pFStack_28;
  pCStack_10->num_designs = memory._2_2_;
  pCStack_10->num_axes = num_axes;
  ppFVar1 = (FT_Byte **)ft_mem_realloc(pFStack_38,8,0,(ulong)memory._4_4_,(void *)0x0,&local_3c);
  pCStack_10->stack = ppFVar1;
  if (local_3c == 0) {
    pCStack_10->stackSize = memory._4_4_;
    pCStack_10->top = pCStack_10->stack;
  }
  else {
    ft_mem_free(pFStack_38,pCStack_10->stack);
    pCStack_10->stack = (FT_Byte **)0x0;
  }
  return local_3c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_parser_init( CFF_Parser  parser,
                   FT_UInt     code,
                   void*       object,
                   FT_Library  library,
                   FT_UInt     stackSize,
                   FT_UShort   num_designs,
                   FT_UShort   num_axes )
  {
    FT_Memory  memory = library->memory;    /* for FT_NEW_ARRAY */
    FT_Error   error;                       /* for FT_NEW_ARRAY */


    FT_ZERO( parser );

#if 0
    parser->top         = parser->stack;
#endif
    parser->object_code = code;
    parser->object      = object;
    parser->library     = library;
    parser->num_designs = num_designs;
    parser->num_axes    = num_axes;

    /* allocate the stack buffer */
    if ( FT_NEW_ARRAY( parser->stack, stackSize ) )
    {
      FT_FREE( parser->stack );
      goto Exit;
    }

    parser->stackSize = stackSize;
    parser->top       = parser->stack;    /* empty stack */

  Exit:
    return error;
  }